

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O3

void __thiscall
TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator::
~TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator
          (TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator *this)

{
  (this->super_Utest)._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupAccountingTestMemoryAllocator_00389898;
  MemoryAccountant::~MemoryAccountant(&this->accountant);
  Utest::~Utest(&this->super_Utest);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST_GROUP(AccountingTestMemoryAllocator)
{
    MemoryAccountant accountant;
    AccountingTestMemoryAllocator *allocator;

    void setup() _override
    {
        allocator = new AccountingTestMemoryAllocator(accountant, getCurrentMallocAllocator());
    }

    void teardown() _override
    {
        accountant.clear();
        delete allocator;
    }
}